

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

void cimg_library::CImg<unsigned_char>::_load_inr_header(FILE *file,int *out,float *voxel_size)

{
  char cVar1;
  int iVar2;
  long lVar3;
  CImgIOException *this;
  char cVar4;
  char cVar5;
  CImg<char> item;
  char tmp1 [64];
  char tmp2 [64];
  CImg<char> local_118;
  int *local_f8;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  FILE *local_c0;
  char local_b8 [64];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  CImg<char>::CImg(&local_118,0x400,1,1,1);
  *local_118._data = '\0';
  local_b8[0x30] = '\0';
  local_b8[0x31] = '\0';
  local_b8[0x32] = '\0';
  local_b8[0x33] = '\0';
  local_b8[0x34] = '\0';
  local_b8[0x35] = '\0';
  local_b8[0x36] = '\0';
  local_b8[0x37] = '\0';
  local_b8[0x38] = '\0';
  local_b8[0x39] = '\0';
  local_b8[0x3a] = '\0';
  local_b8[0x3b] = '\0';
  local_b8[0x3c] = '\0';
  local_b8[0x3d] = '\0';
  local_b8[0x3e] = '\0';
  local_b8[0x3f] = '\0';
  local_b8[0x20] = '\0';
  local_b8[0x21] = '\0';
  local_b8[0x22] = '\0';
  local_b8[0x23] = '\0';
  local_b8[0x24] = '\0';
  local_b8[0x25] = '\0';
  local_b8[0x26] = '\0';
  local_b8[0x27] = '\0';
  local_b8[0x28] = '\0';
  local_b8[0x29] = '\0';
  local_b8[0x2a] = '\0';
  local_b8[0x2b] = '\0';
  local_b8[0x2c] = '\0';
  local_b8[0x2d] = '\0';
  local_b8[0x2e] = '\0';
  local_b8[0x2f] = '\0';
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0x1e] = '\0';
  local_b8[0x1f] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_c0 = file;
  __isoc99_fscanf(file,"%63s",local_118._data);
  out[0] = 1;
  out[1] = 1;
  out[2] = 1;
  out[3] = 1;
  out[4] = -1;
  out[5] = 1;
  out[6] = -1;
  out[7] = -1;
  if (local_118._data != (char *)0x0) {
    local_f0 = out + 3;
    local_e0 = out + 2;
    local_e8 = out + 1;
    local_f8 = out + 6;
    lVar3 = 0;
    do {
      cVar1 = local_118._data[lVar3];
      cVar4 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar4 = cVar1;
      }
      cVar1 = "#INRIMAGE-4#{"[lVar3];
      cVar5 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar5 = cVar1;
      }
      if (cVar4 != cVar5) {
        if ((int)lVar3 != 0xd) goto LAB_001373f9;
        break;
      }
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 0xd);
    local_d0 = voxel_size + 1;
    local_d8 = voxel_size + 2;
    local_c8 = voxel_size;
LAB_00136f71:
    do {
      iVar2 = __isoc99_fscanf(local_c0," %63[^\n]%*c",local_118._data);
      if ((iVar2 == -1) ||
         (((*local_118._data == '#' && (local_118._data[1] == '#')) && (local_118._data[2] == '}')))
         ) {
        if (((*out < 0) || (*local_e8 < 0)) || ((*local_e0 < 0 || (*local_f0 < 0)))) {
          this = (CImgIOException *)__cxa_allocate_exception(0x10);
          CImgIOException::CImgIOException
                    (this,
                     "CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                     "unsigned char",(ulong)(uint)*out,(ulong)(uint)out[1],(ulong)(uint)out[2],
                     out[3]);
        }
        else if ((out[4] < 0) || (out[5] < 0)) {
          this = (CImgIOException *)__cxa_allocate_exception(0x10);
          CImgIOException::CImgIOException
                    (this,"CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                     "unsigned char");
        }
        else if (*local_f8 < 0) {
          this = (CImgIOException *)__cxa_allocate_exception(0x10);
          CImgIOException::CImgIOException
                    (this,"CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                     "unsigned char");
        }
        else {
          if (-1 < out[7]) {
            if ((local_118._is_shared == false) && (local_118._data != (char *)0x0)) {
              operator_delete__(local_118._data);
            }
            return;
          }
          this = (CImgIOException *)__cxa_allocate_exception(0x10);
          CImgIOException::CImgIOException
                    (this,"CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header."
                     ,"unsigned char");
        }
        goto LAB_0013746c;
      }
      __isoc99_sscanf(local_118._data," XDIM%*[^0-9]%d",out);
      __isoc99_sscanf(local_118._data," YDIM%*[^0-9]%d",local_e8);
      __isoc99_sscanf(local_118._data," ZDIM%*[^0-9]%d",local_e0);
      __isoc99_sscanf(local_118._data," VDIM%*[^0-9]%d",local_f0);
      __isoc99_sscanf(local_118._data," PIXSIZE%*[^0-9]%d",local_f8);
      if (local_c8 != (float *)0x0) {
        __isoc99_sscanf(local_118._data," VX%*[^0-9.+-]%f");
        __isoc99_sscanf(local_118._data," VY%*[^0-9.+-]%f",local_d0);
        __isoc99_sscanf(local_118._data," VZ%*[^0-9.+-]%f",local_d8);
      }
      iVar2 = __isoc99_sscanf(local_118._data," CPU%*[ =]%s",local_b8);
      if (iVar2 != 0) {
        lVar3 = 0;
        do {
          cVar1 = local_b8[lVar3];
          cVar4 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar4 = cVar1;
          }
          cVar1 = "sun"[lVar3];
          cVar5 = cVar1 + ' ';
          if ((byte)(cVar1 + 0xa5U) < 0xe6) {
            cVar5 = cVar1;
          }
          if (cVar4 != cVar5) {
            iVar2 = 0;
            if ((int)lVar3 != 3) goto LAB_001370c9;
            break;
          }
          lVar3 = lVar3 + 1;
        } while ((int)lVar3 != 3);
        iVar2 = 1;
LAB_001370c9:
        out[7] = iVar2;
      }
      iVar2 = __isoc99_sscanf(local_118._data," TYPE%*[ =]%s %s",local_b8,&local_78);
    } while (iVar2 == 0);
    if (iVar2 != 1) {
      if (iVar2 != 2) goto LAB_00137366;
      lVar3 = 0;
      do {
        cVar1 = local_b8[lVar3];
        cVar4 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar4 = cVar1;
        }
        cVar1 = "unsigned"[lVar3];
        cVar5 = cVar1 + ' ';
        if ((byte)(cVar1 + 0xa5U) < 0xe6) {
          cVar5 = cVar1;
        }
        if (cVar4 != cVar5) {
          iVar2 = 1;
          if ((int)lVar3 != 8) goto LAB_0013714a;
          break;
        }
        lVar3 = lVar3 + 1;
      } while ((int)lVar3 != 8);
      iVar2 = 0;
LAB_0013714a:
      out[5] = iVar2;
      strncpy(local_b8,(char *)&local_78,0x3f);
    }
    lVar3 = 0;
    do {
      cVar1 = local_b8[lVar3];
      cVar4 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar4 = cVar1;
      }
      cVar1 = "unsigned int"[lVar3 + 9];
      cVar5 = cVar1 + ' ';
      if ((byte)(cVar1 + 0xa5U) < 0xe6) {
        cVar5 = cVar1;
      }
      if (cVar4 != cVar5) {
        if ((int)lVar3 != 3) {
          lVar3 = 0;
          goto LAB_001371a7;
        }
        break;
      }
      lVar3 = lVar3 + 1;
    } while ((int)lVar3 != 3);
    goto LAB_001371ec;
  }
LAB_001373f9:
  this = (CImgIOException *)__cxa_allocate_exception(0x10);
  CImgIOException::CImgIOException
            (this,"CImg<%s>::load_inr(): INRIMAGE-4 header not found.","unsigned char");
LAB_0013746c:
  __cxa_throw(this,&CImgIOException::typeinfo,CImgException::~CImgException);
  while (lVar3 = lVar3 + 1, (int)lVar3 != 5) {
LAB_001371a7:
    cVar1 = local_b8[lVar3];
    cVar4 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar4 = cVar1;
    }
    cVar1 = "fixed"[lVar3];
    cVar5 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar5 = cVar1;
    }
    if (cVar4 != cVar5) {
      if ((int)lVar3 != 5) goto LAB_001371f3;
      break;
    }
  }
LAB_001371ec:
  out[4] = 0;
LAB_001371f3:
  lVar3 = 0;
  do {
    cVar1 = local_b8[lVar3];
    cVar4 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar4 = cVar1;
    }
    cVar1 = "float"[lVar3];
    cVar5 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar5 = cVar1;
    }
    if (cVar4 != cVar5) {
      if ((int)lVar3 != 5) {
        lVar3 = 0;
        goto LAB_00137235;
      }
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 5);
LAB_0013727a:
  out[4] = 1;
LAB_00137281:
  lVar3 = 0;
  do {
    cVar1 = local_b8[lVar3];
    cVar4 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar4 = cVar1;
    }
    cVar1 = "packed"[lVar3];
    cVar5 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar5 = cVar1;
    }
    if (cVar4 != cVar5) {
      if ((int)lVar3 != 6) {
        if (out[4] < 0) goto LAB_00137366;
        goto LAB_00136f71;
      }
      break;
    }
    lVar3 = lVar3 + 1;
  } while ((int)lVar3 != 6);
  out[4] = 2;
  goto LAB_00136f71;
  while (lVar3 = lVar3 + 1, (int)lVar3 != 6) {
LAB_00137235:
    cVar1 = local_b8[lVar3];
    cVar4 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar4 = cVar1;
    }
    cVar1 = "double"[lVar3];
    cVar5 = cVar1 + ' ';
    if ((byte)(cVar1 + 0xa5U) < 0xe6) {
      cVar5 = cVar1;
    }
    if (cVar4 != cVar5) {
      if ((int)lVar3 != 6) goto LAB_00137281;
      break;
    }
  }
  goto LAB_0013727a;
LAB_00137366:
  this = (CImgIOException *)__cxa_allocate_exception(0x10);
  CImgIOException::CImgIOException
            (this,"CImg<%s>::load_inr(): Invalid pixel type \'%s\' defined in header.",
             "unsigned char",&local_78);
  goto LAB_0013746c;
}

Assistant:

static void _load_inr_header(std::FILE *file, int out[8], float *const voxel_size) {
      CImg<charT> item(1024); *item = 0;
      char tmp1[64] = { 0 }, tmp2[64] = { 0 };
      out[0] = std::fscanf(file,"%63s",item._data);
      out[0] = out[1] = out[2] = out[3] = out[5] = 1; out[4] = out[6] = out[7] = -1;
      if(cimg::strncasecmp(item,"#INRIMAGE-4#{",13)!=0)
        throw CImgIOException("CImg<%s>::load_inr(): INRIMAGE-4 header not found.",
                              pixel_type());

      while (std::fscanf(file," %63[^\n]%*c",item._data)!=EOF && std::strncmp(item,"##}",3)) {
        cimg_sscanf(item," XDIM%*[^0-9]%d",out);
        cimg_sscanf(item," YDIM%*[^0-9]%d",out + 1);
        cimg_sscanf(item," ZDIM%*[^0-9]%d",out + 2);
        cimg_sscanf(item," VDIM%*[^0-9]%d",out + 3);
        cimg_sscanf(item," PIXSIZE%*[^0-9]%d",out + 6);
        if (voxel_size) {
          cimg_sscanf(item," VX%*[^0-9.+-]%f",voxel_size);
          cimg_sscanf(item," VY%*[^0-9.+-]%f",voxel_size + 1);
          cimg_sscanf(item," VZ%*[^0-9.+-]%f",voxel_size + 2);
        }
        if (cimg_sscanf(item," CPU%*[ =]%s",tmp1)) out[7]=cimg::strncasecmp(tmp1,"sun",3)?0:1;
        switch (cimg_sscanf(item," TYPE%*[ =]%s %s",tmp1,tmp2)) {
        case 0 : break;
        case 2 : out[5] = cimg::strncasecmp(tmp1,"unsigned",8)?1:0; std::strncpy(tmp1,tmp2,sizeof(tmp1) - 1);
        case 1 :
          if (!cimg::strncasecmp(tmp1,"int",3)   || !cimg::strncasecmp(tmp1,"fixed",5))  out[4] = 0;
          if (!cimg::strncasecmp(tmp1,"float",5) || !cimg::strncasecmp(tmp1,"double",6)) out[4] = 1;
          if (!cimg::strncasecmp(tmp1,"packed",6))                                       out[4] = 2;
          if (out[4]>=0) break;
        default :
          throw CImgIOException("CImg<%s>::load_inr(): Invalid pixel type '%s' defined in header.",
                                pixel_type(),
                                tmp2);
        }
      }
      if(out[0]<0 || out[1]<0 || out[2]<0 || out[3]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Invalid dimensions (%d,%d,%d,%d) defined in header.",
                              pixel_type(),
                              out[0],out[1],out[2],out[3]);
      if(out[4]<0 || out[5]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete pixel type defined in header.",
                              pixel_type());
      if(out[6]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Incomplete PIXSIZE field defined in header.",
                              pixel_type());
      if(out[7]<0)
        throw CImgIOException("CImg<%s>::load_inr(): Big/Little Endian coding type undefined in header.",
                              pixel_type());
    }